

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  slot_type *psVar5;
  slot_type sVar6;
  undefined1 auVar7 [16];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  undefined8 uVar23;
  ctrl_t *pcVar24;
  size_t i;
  ulong uVar25;
  ulong uVar26;
  byte bVar27;
  size_t i_00;
  FindInfo FVar28;
  
  uVar3 = this->capacity_;
  if (uVar3 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x248,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if (uVar3 - (uVar3 >> 3) >> 1 < this->size_) {
    resize(this,uVar3 * 2 + 1);
    return;
  }
  uVar3 = this->capacity_;
  if ((uVar3 == 0) || ((uVar3 + 1 & uVar3) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned long>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<unsigned long>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<unsigned long>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<unsigned long>]"
                 );
  }
  if (uVar3 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned long>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<unsigned long>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<unsigned long>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<unsigned long>]"
                 );
  }
  pcVar4 = this->ctrl_;
  if (pcVar4[uVar3] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x230,
                  "void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *__restrict, size_t)"
                 );
  }
  pcVar24 = pcVar4 + uVar3;
  if (pcVar24 + 1 != pcVar4) {
    uVar26 = 0;
    do {
      pcVar1 = pcVar4 + uVar26;
      cVar8 = pcVar1[1];
      cVar9 = pcVar1[2];
      cVar10 = pcVar1[3];
      cVar11 = pcVar1[4];
      cVar12 = pcVar1[5];
      cVar13 = pcVar1[6];
      cVar14 = pcVar1[7];
      cVar15 = pcVar1[8];
      cVar16 = pcVar1[9];
      cVar17 = pcVar1[10];
      cVar18 = pcVar1[0xb];
      cVar19 = pcVar1[0xc];
      cVar20 = pcVar1[0xd];
      cVar21 = pcVar1[0xe];
      cVar22 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar4 + uVar26);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      uVar26 = uVar26 + 0x10;
    } while (uVar3 + 1 != uVar26);
  }
  uVar23 = *(undefined8 *)(pcVar4 + 8);
  *(undefined8 *)(pcVar24 + 1) = *(undefined8 *)pcVar4;
  *(undefined8 *)(pcVar24 + 9) = uVar23;
  *pcVar24 = -1;
  if (this->capacity_ == 0) {
    i_00 = 0;
  }
  else {
    i_00 = 0;
    do {
      if (this->ctrl_[i_00] == -2) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = this->slots_[i_00];
        uVar26 = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar7,8) +
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar7,0);
        FVar28 = find_first_non_full(this,uVar26);
        i = FVar28.offset;
        uVar3 = this->capacity_;
        if ((uVar3 + 1 & uVar3) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar25 = uVar26 >> 7 & uVar3;
        bVar27 = (byte)uVar26;
        if (((i_00 - uVar25 ^ i - uVar25) & uVar3) < 0x10) {
          bVar27 = bVar27 & 0x7f;
        }
        else {
          if (this->ctrl_[i] == -2) {
            set_ctrl(this,i,bVar27 & 0x7f);
            psVar5 = this->slots_;
            sVar6 = psVar5[i_00];
            psVar5[i_00] = psVar5[i];
            psVar5[i] = sVar6;
            i_00 = i_00 - 1;
            goto LAB_00102b1a;
          }
          if (this->ctrl_[i] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x853,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned long>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<unsigned long>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<unsigned long>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<unsigned long>]"
                         );
          }
          set_ctrl(this,i,bVar27 & 0x7f);
          this->slots_[i] = this->slots_[i_00];
          bVar27 = 0x80;
        }
        set_ctrl(this,i_00,bVar27);
      }
LAB_00102b1a:
      i_00 = i_00 + 1;
    } while (i_00 != this->capacity_);
  }
  reset_growth_left(this,i_00);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }